

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quass.cpp
# Opt level: O3

QpAsmStatus
solveqp(Instance *instance,Settings *settings,Statistics *stats,HighsModelStatus *highs_model_status
       ,HighsBasis *highs_basis,HighsSolution *highs_solution,HighsTimer *qp_timer)

{
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  pointer *ppBVar1;
  pointer *ppiVar2;
  HighsBasisStatus HVar3;
  undefined2 uVar4;
  int iVar5;
  int *piVar6;
  pointer pdVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  HighsStatus HVar11;
  QpAsmStatus QVar12;
  int iVar13;
  double *pdVar14;
  pointer piVar15;
  size_t __nbytes;
  ulong uVar16;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  ulong uVar17;
  HighsInt HVar18;
  ulong uVar19;
  long lVar20;
  pointer pdVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  double extraout_XMM0_Qa;
  double dVar27;
  double dVar28;
  double dVar29;
  HighsSolution *highs_solution_00;
  BasisStatus local_5cc0;
  QpModelStatus qp_model_status;
  vector<BasisStatus,_std::allocator<BasisStatus>_> atlower;
  vector<BasisStatus,_std::allocator<BasisStatus>_> initial_status;
  vector<int,_std::allocator<int>_> debug_col_status_count;
  vector<int,_std::allocator<int>_> initialinactive;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c28;
  undefined1 local_5c18 [16];
  undefined1 local_5c08 [8];
  undefined1 auStack_5c00 [16];
  HighsBasisStatus *pHStack_5bf0;
  Statistics *local_5be0;
  vector<int,_std::allocator<int>_> initialactive;
  int local_5bb8;
  undefined1 local_5bb4;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_5ba8;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> vStack_5b90;
  vector<double,_std::allocator<double>_> L;
  vector<double,_std::allocator<double>_> vStack_5b58;
  vector<double,_std::allocator<double>_> local_5b40;
  vector<double,_std::allocator<double>_> vStack_5b28;
  QpSolution *local_5b10;
  vector<int,_std::allocator<int>_> debug_row_status_count;
  QpHotstartInformation local_5ae8;
  QpVector x0;
  vector<double,_std::allocator<double>_> local_59f8;
  vector<double,_std::allocator<double>_> local_59e0;
  vector<double,_std::allocator<double>_> local_59c8;
  MatrixFormat local_59b0;
  vector<int,_std::allocator<int>_> local_59a0 [2];
  vector<int,_std::allocator<int>_> local_5970;
  vector<double,_std::allocator<double>_> local_5958 [29];
  QpSolution local_5698;
  QpVector ra;
  QpVector res;
  vector<double,_std::allocator<double>_> local_51b0;
  vector<double,_std::allocator<double>_> local_5198;
  pointer local_5180;
  HighsInt local_5178;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_5150;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_5138 [149];
  HighsInt local_4330;
  HighsModelStatus local_3fac;
  
  qp_model_status = kUndetermined;
  local_5be0 = stats;
  local_5b10 = (QpSolution *)highs_model_status;
  QpSolution::QpSolution(&local_5698,instance);
  iVar13 = instance->num_var;
  if (0 < (long)iVar13) {
    piVar6 = (instance->Q).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar15 = (instance->Q).mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = 0;
    iVar10 = *piVar6;
    do {
      iVar5 = piVar6[uVar19 + 1];
      if (iVar10 < iVar5) {
        pdVar21 = (instance->Q).mat.value.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar22 = (long)iVar10;
        do {
          if (uVar19 == (uint)piVar15[lVar22]) {
            pdVar21[lVar22] = settings->hessianregularizationfactor + pdVar21[lVar22];
          }
          lVar22 = lVar22 + 1;
        } while (iVar5 != lVar22);
      }
      uVar19 = uVar19 + 1;
      iVar10 = iVar5;
    } while (uVar19 != (long)iVar13);
  }
  QpHotstartInformation::QpHotstartInformation(&local_5ae8,iVar13,instance->num_con);
  iVar13 = instance->num_var;
  if (iVar13 < 0x3a99 && instance->num_con == 0) {
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize(&L,(ulong)(uint)(iVar13 * iVar13));
    uVar19 = (ulong)(uint)instance->num_var;
    if (instance->num_var != 0) {
      piVar15 = (instance->Q).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar22 = 0;
      uVar25 = 0;
      do {
        uVar17 = (ulong)piVar15[uVar25];
        uVar26 = uVar25 + 1;
        if ((uint)piVar15[uVar25] < (uint)piVar15[uVar25 + 1]) {
          do {
            iVar13 = (instance->Q).mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar17];
            uVar16 = (ulong)iVar13;
            if (uVar25 == uVar16) {
              if (iVar13 == 0) {
                dVar27 = 0.0;
              }
              else {
                pdVar14 = (double *)
                          ((long)L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar22);
                dVar27 = 0.0;
                uVar16 = uVar25;
                do {
                  dVar27 = dVar27 + *pdVar14 * *pdVar14;
                  pdVar14 = pdVar14 + (int)uVar19;
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
              dVar27 = (instance->Q).mat.value.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar17] - dVar27;
              if (dVar27 < 0.0) {
                dVar27 = sqrt(dVar27);
              }
              else {
                dVar27 = SQRT(dVar27);
              }
              uVar19 = (ulong)instance->num_var;
              L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[(uVar19 + 1) * uVar25] = dVar27;
              piVar15 = (instance->Q).mat.start.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            }
            else {
              lVar20 = (long)(int)uVar19;
              if (iVar13 == 0) {
                dVar27 = 0.0;
              }
              else {
                dVar27 = 0.0;
                pdVar21 = L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar23 = uVar16;
                do {
                  dVar27 = dVar27 + *(double *)((long)pdVar21 + lVar22) * pdVar21[uVar16];
                  pdVar21 = pdVar21 + lVar20;
                  uVar23 = uVar23 - 1;
                } while (uVar23 != 0);
              }
              L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar16 * lVar20 + uVar25] =
                   ((instance->Q).mat.value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar17] - dVar27) /
                   L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(lVar20 + 1) * uVar16];
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < (ulong)(long)piVar15[uVar26]);
        }
        lVar22 = lVar22 + 8;
        uVar25 = uVar26;
      } while (uVar26 < (ulong)(long)(int)uVar19);
    }
    QpVector::operator-(&res,&instance->c);
    lVar22 = (long)res.dim;
    if (0 < lVar22) {
      iVar13 = instance->num_var;
      lVar20 = 0;
      pdVar21 = L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (lVar20 == 0) {
          dVar27 = *res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          dVar27 = res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20];
          lVar24 = 0;
          pdVar14 = pdVar21;
          do {
            dVar27 = dVar27 - res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar24] * *pdVar14;
            res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar20] = dVar27;
            lVar24 = lVar24 + 1;
            pdVar14 = pdVar14 + iVar13;
          } while (lVar20 != lVar24);
        }
        res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar20] =
             dVar27 / L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(iVar13 + 1) * (int)lVar20];
        lVar20 = lVar20 + 1;
        pdVar21 = pdVar21 + 1;
      } while (lVar20 != lVar22);
      iVar13 = instance->num_var;
      pdVar21 = L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (lVar22 + -1) * (long)iVar13 + -1;
      lVar20 = lVar22;
      do {
        dVar27 = 0.0;
        for (lVar24 = lVar22; lVar20 < lVar24; lVar24 = lVar24 + -1) {
          dVar27 = dVar27 + res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar24 + -1] * pdVar21[lVar24];
        }
        lVar24 = lVar20 + -1;
        res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar24] =
             (res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24] - dVar27) /
             L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[(iVar13 + 1) * (int)lVar24];
        pdVar21 = pdVar21 + -(long)iVar13;
        bVar8 = 1 < lVar20;
        lVar20 = lVar24;
      } while (bVar8);
    }
    QpVector::QpVector(&x0,instance->num_var);
    highs_solution_00 = (HighsSolution *)0x32e8f9;
    QpVector::QpVector(&ra,instance->num_con);
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._4_4_ = 0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    piVar6 = (int *)0x0;
    if (instance->num_var < 1) {
LAB_0032ec1f:
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar6;
      qp_model_status = kOptimal;
    }
    else {
      lVar22 = 0;
      do {
        dVar27 = res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22];
        dVar28 = 0.5 / settings->hessianregularizationfactor;
        if ((((dVar28 < dVar27) &&
             (INFINITY <=
              (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar22])) &&
            (pdVar14 = (instance->c).value.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar22,
            *pdVar14 <= 0.0 && *pdVar14 != 0.0)) ||
           (((dVar29 = (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar22], dVar27 < dVar28 &&
             (INFINITY <= dVar29)) &&
            (dVar29 = INFINITY,
            0.0 < (instance->c).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar22])))) {
          qp_model_status = kUnbounded;
          goto LAB_0032ecd6;
        }
        iVar13 = (int)lVar22;
        if (dVar27 <= dVar29) {
          res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22] = dVar29;
          iVar10 = instance->num_con + iVar13;
          initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(initial_status.
                                 super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar10);
          if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            highs_solution_00 = (HighsSolution *)0x32ea91;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&initialactive,
                       (iterator)
                       initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&initial_status);
          }
          else {
            *initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = iVar10;
            initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(initial_status.
                                 super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,1);
          if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            highs_solution_00 = (HighsSolution *)0x32eab8;
            std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                      (&atlower,(iterator)
                                atlower.
                                super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                _M_impl.super__Vector_impl_data._M_finish,
                       (BasisStatus *)&initial_status);
          }
          else {
            *atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
             super__Vector_impl_data._M_finish = kActiveAtLower;
LAB_0032eaf1:
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          dVar28 = (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar22];
          if (dVar28 <= dVar27) {
            res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar22] = dVar28;
            iVar10 = instance->num_con + iVar13;
            initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(initial_status.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar10);
            if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              highs_solution_00 = (HighsSolution *)0x32ead7;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&initialactive,
                         (iterator)
                         initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&initial_status);
            }
            else {
              *initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = iVar10;
              initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(initial_status.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,2);
            if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish = kActiveAtUpper;
              goto LAB_0032eaf1;
            }
            highs_solution_00 = (HighsSolution *)0x32eb67;
            std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                      (&atlower,(iterator)
                                atlower.
                                super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                _M_impl.super__Vector_impl_data._M_finish,
                       (BasisStatus *)&initial_status);
          }
          else {
            iVar10 = instance->num_con + iVar13;
            initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(initial_status.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar10);
            if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              highs_solution_00 = (HighsSolution *)0x32eaca;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&initialinactive,
                         (iterator)
                         initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&initial_status);
            }
            else {
              *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = iVar10;
              initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        if (0.0001 < ABS(res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar22])) {
          x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22] =
               res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar22];
          lVar20 = (long)x0.num_nz;
          x0.num_nz = x0.num_nz + 1;
          x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar20] = iVar13;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < instance->num_var);
      piVar6 = initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_0032ec1f;
    }
    std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=(&local_5ae8.status,&atlower);
    std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.active,&initialactive);
    std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.inactive,&initialinactive);
    local_5ae8.primal.num_nz = x0.num_nz;
    local_5ae8.primal.dim = x0.dim;
    std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.primal.index,&x0.index);
    std::vector<double,_std::allocator<double>_>::operator=(&local_5ae8.primal.value,&x0.value);
    local_5ae8.rowact.num_nz = ra.num_nz;
    local_5ae8.rowact.dim = ra.dim;
    std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.rowact.index,&ra.index);
    highs_solution_00 = (HighsSolution *)0x32ecc7;
    std::vector<double,_std::allocator<double>_>::operator=(&local_5ae8.rowact.value,&ra.value);
LAB_0032ecd6:
    if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ece5;
      operator_delete(atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((void *)CONCAT44(initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ecf7;
      operator_delete((void *)CONCAT44(initialinactive.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       initialinactive.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ed09;
      operator_delete(initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (ra.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ed1b;
      operator_delete(ra.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (ra.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ed2d;
      operator_delete(ra.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ed3f;
      operator_delete(x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ed51;
      operator_delete(x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ed63;
      operator_delete(res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((void *)CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,
                         res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_2_) != (void *)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ed75;
      operator_delete((void *)CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._2_6_,
                                       res.index.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_2_));
    }
    if (L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32ed87;
      operator_delete(L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (qp_model_status == kUnbounded) goto LAB_0032fd42;
    if (qp_model_status == kOptimal) {
      local_5698.primal.num_nz = local_5ae8.primal.num_nz;
      local_5698.primal.dim = local_5ae8.primal.dim;
      std::vector<int,_std::allocator<int>_>::operator=
                (&local_5698.primal.index,&local_5ae8.primal.index);
      highs_solution_00 = (HighsSolution *)0x32edcf;
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_5698.primal.value,&local_5ae8.primal.value);
      goto LAB_0032fd42;
    }
  }
  else {
    cVar9 = '\0';
    if (highs_solution->value_valid == true) {
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      res.num_nz = 0;
      res.dim = 0;
      x0.num_nz = 0;
      x0.dim = 0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)initial_status.
                            super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
      ra.num_nz = 0;
      ra.dim = 0;
      L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = 0;
      assessQpPrimalFeasibility
                (instance,settings->lambda_zero_threshold,&highs_solution->col_value,
                 &highs_solution->row_value,(HighsInt *)&atlower,(double *)&res,(double *)&x0,
                 (HighsInt *)&initial_status,(double *)&ra,(double *)&L,(double *)&initialactive,
                 (double *)&initialinactive);
      if ((int)initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start == 0 &&
          (int)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start == 0) {
        cVar9 = highs_basis->valid;
      }
      else {
        cVar9 = '\0';
      }
    }
    __nbytes = 0xffffffff01000100;
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xffffffff01000100;
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(initialactive.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,0xffffffff);
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = &local_5bb8;
    local_5bb8 = 0x656e6f4e;
    local_5bb4 = 0;
    local_5ba8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_5ba8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5ba8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_5b90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_5b90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_5b90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffff0000);
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (cVar9 == '\0') {
      Highs::Highs((Highs *)&res);
      ppiVar2 = &x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_7_ = 0x5f74757074756f;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._7_1_ = 0x66;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0x6c;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._1_1_ = 0x61;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._2_1_ = 0x67;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0xb;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._3_1_ = 0;
      x0._0_8_ = ppiVar2;
      Highs::setOptionValue((Highs *)&res,(string *)&x0,false);
      if ((pointer *)x0._0_8_ != ppiVar2) {
        operator_delete((void *)x0._0_8_);
      }
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_7_ = 0x766c6f73657270;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._7_1_ = 0x65;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x8;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0;
      x0._0_8_ = ppiVar2;
      Highs::setOptionValue((Highs *)&res,(string *)&x0,&kHighsOnString_abi_cxx11_);
      __buf = extraout_RDX;
      if ((pointer *)x0._0_8_ != ppiVar2) {
        operator_delete((void *)x0._0_8_);
        __buf = extraout_RDX_00;
      }
      dVar27 = settings->time_limit;
      HighsTimer::read(qp_timer,0,__buf,__nbytes);
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_7_ = 0x696c5f656d6974;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._7_1_ = 0x6d;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0x69;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._1_1_ = 0x74;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0xa;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._2_1_ = 0;
      dVar27 = dVar27 - extraout_XMM0_Qa;
      dVar28 = 0.001;
      if (0.001 <= dVar27) {
        dVar28 = dVar27;
      }
      x0._0_8_ = ppiVar2;
      Highs::setOptionValue((Highs *)&res,(string *)&x0,dVar28);
      if ((pointer *)x0._0_8_ != ppiVar2) {
        operator_delete((void *)x0._0_8_);
      }
      HighsLp::HighsLp((HighsLp *)&x0);
      std::vector<int,_std::allocator<int>_>::operator=(&local_5970,&(instance->A).mat.index);
      std::vector<int,_std::allocator<int>_>::operator=(local_59a0,&(instance->A).mat.start);
      std::vector<double,_std::allocator<double>_>::operator=(local_5958,&(instance->A).mat.value);
      local_59b0 = kColwise;
      ra.num_nz = 0;
      ra.dim = 0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)&x0.index,(long)instance->num_var,
                 (value_type_conflict1 *)&ra);
      __x = &instance->var_lo;
      std::vector<double,_std::allocator<double>_>::operator=(&x0.value,__x);
      __x_00 = &instance->var_up;
      std::vector<double,_std::allocator<double>_>::operator=(&local_59f8,__x_00);
      std::vector<double,_std::allocator<double>_>::operator=(&local_59e0,&instance->con_lo);
      std::vector<double,_std::allocator<double>_>::operator=(&local_59c8,&instance->con_up);
      x0.num_nz = instance->num_var;
      x0.dim = instance->num_con;
      if ((0 < x0.num_nz & settings->phase1boundfreevars) == 1) {
        pdVar21 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar7 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar19 = 0;
        do {
          if ((pdVar21[uVar19] <= -INFINITY) && (INFINITY <= pdVar7[uVar19])) {
            x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] = -100000.0;
            local_59f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] = 100000.0;
          }
          uVar19 = uVar19 + 1;
        } while ((x0._0_8_ & 0xffffffff) != uVar19);
      }
      HighsLp::HighsLp((HighsLp *)&ra,(HighsLp *)&x0);
      Highs::passModel((Highs *)&res,(HighsLp *)&ra);
      HighsLp::~HighsLp((HighsLp *)&ra);
      if (settings->phase1movefreevarsbasic == true) {
        initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_5c28;
        initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x1000100;
        initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = 0xffffffff;
        initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0xffffffff;
        local_5c28._M_allocated_capacity._0_4_ = 0x656e6f4e;
        local_5c28._M_local_buf[4] = '\0';
        local_5c18 = (undefined1  [16])0x0;
        _local_5c08 = (undefined1  [16])0x0;
        stack0xffffffffffffa408 = (undefined1  [16])0x0;
        iVar13 = instance->num_con;
        if (0 < iVar13) {
          iVar10 = 0;
          do {
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(atlower.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,4);
            if ((HighsBasisStatus *)auStack_5c00._8_8_ == pHStack_5bf0) {
              std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
              _M_realloc_insert<HighsBasisStatus>
                        ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                         (local_5c08 + 8),(iterator)auStack_5c00._8_8_,(HighsBasisStatus *)&atlower)
              ;
              iVar13 = instance->num_con;
            }
            else {
              *(HighsBasisStatus *)auStack_5c00._8_8_ = kNonbasic;
              auStack_5c00._8_8_ = (HighsBasisStatus *)(auStack_5c00._8_8_ + 1);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < iVar13);
        }
        if (0 < instance->num_var) {
          lVar22 = 0;
          do {
            if ((-INFINITY <
                 (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar22]) ||
               ((__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar22] < INFINITY)) {
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(atlower.
                                     super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,4);
              if ((undefined1  [8])local_5c18._8_8_ != local_5c08) {
                *(HighsBasisStatus *)local_5c18._8_8_ = kNonbasic;
                goto LAB_0032f8ed;
              }
              std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
              _M_realloc_insert<HighsBasisStatus>
                        ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)local_5c18,
                         (iterator)local_5c18._8_8_,(HighsBasisStatus *)&atlower);
            }
            else {
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(atlower.
                                     super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,1);
              if ((undefined1  [8])local_5c18._8_8_ == local_5c08) {
                std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
                _M_realloc_insert<HighsBasisStatus>
                          ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)local_5c18
                           ,(iterator)local_5c18._8_8_,(HighsBasisStatus *)&atlower);
              }
              else {
                *(HighsBasisStatus *)local_5c18._8_8_ = kBasic;
LAB_0032f8ed:
                local_5c18._8_8_ = (HighsBasisStatus *)(local_5c18._8_8_ + 1);
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < instance->num_var);
        }
        ppBVar1 = &atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppBVar1;
        Highs::setBasis((Highs *)&res,(HighsBasis *)&initialinactive,(string *)&atlower);
        if ((pointer *)
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start != ppBVar1) {
          operator_delete(atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x10;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppBVar1;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)std::__cxx11::string::_M_create((ulong *)&atlower,(ulong)&initial_status);
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(undefined8 *)
         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
         super__Vector_impl_data._M_start = 0x5f78656c706d6973;
        *(undefined8 *)
         (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start + 2) = 0x7967657461727473;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_finish =
             initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(char *)((long)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                 (long)initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                       _M_impl.super__Vector_impl_data._M_start) = '\0';
        Highs::setOptionValue((Highs *)&res,(string *)&atlower,4);
        if ((pointer *)
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start != ppBVar1) {
          operator_delete(atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if ((pointer)auStack_5c00._0_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_5c00._0_8_);
        }
        if ((pointer)local_5c18._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_5c18._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != &local_5c28) {
          operator_delete(initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        }
      }
      HVar11 = Highs::run((Highs *)&res);
      if (HVar11 == kError) {
        qp_model_status = kError;
        HighsLp::~HighsLp((HighsLp *)&x0);
      }
      else {
        if ((int)local_3fac < 0xd) {
          if (local_3fac == kOptimal) {
            qp_model_status = kNotset;
            local_5be0->phase1_iterations = local_4330;
            initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(initialactive.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish._4_4_,local_5178);
            initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = local_5180;
            std::__cxx11::string::_M_assign
                      ((string *)
                       &initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                      (&local_5ba8,&local_5150);
            std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                      (&vStack_5b90,local_5138);
            L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT62(L.super__Vector_base<double,_std::allocator<double>_>.
                                         _M_impl.super__Vector_impl_data._M_start._2_6_,
                                         res.index.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_2_);
            std::vector<double,_std::allocator<double>_>::operator=
                      ((vector<double,_std::allocator<double>_> *)
                       &L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish,
                       (vector<double,_std::allocator<double>_> *)
                       &res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            std::vector<double,_std::allocator<double>_>::operator=
                      (&vStack_5b58,
                       (vector<double,_std::allocator<double>_> *)
                       &res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            std::vector<double,_std::allocator<double>_>::operator=(&local_5b40,&local_51b0);
            std::vector<double,_std::allocator<double>_>::operator=(&vStack_5b28,&local_5198);
            HighsLp::~HighsLp((HighsLp *)&x0);
            Highs::~Highs((Highs *)&res);
            dVar27 = 0.0001;
            goto LAB_0032ef04;
          }
          qp_model_status = kInfeasible;
          if (local_3fac != kInfeasible) {
LAB_0032fb5c:
            qp_model_status = kError;
          }
        }
        else if (local_3fac == kTimeLimit) {
          qp_model_status = kTimeLimit;
        }
        else {
          if (local_3fac != kInterrupt) goto LAB_0032fb5c;
          qp_model_status = kInterrupt;
        }
        local_5be0->phase1_iterations = local_4330;
        HighsLp::~HighsLp((HighsLp *)&x0);
      }
      highs_solution_00 = (HighsSolution *)0x32fc86;
      Highs::~Highs((Highs *)&res);
    }
    else {
      initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(initialactive.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    highs_basis->debug_update_count);
      initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)highs_basis;
      std::__cxx11::string::_M_assign
                ((string *)
                 &initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                (&local_5ba8,&highs_basis->col_status);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                (&vStack_5b90,&highs_basis->row_status);
      uVar4._0_1_ = highs_solution->value_valid;
      uVar4._1_1_ = highs_solution->dual_valid;
      L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)CONCAT62(L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._2_6_,uVar4);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)
                 &L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish,&highs_solution->col_value);
      std::vector<double,_std::allocator<double>_>::operator=
                (&vStack_5b58,&highs_solution->col_dual);
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_5b40,&highs_solution->row_value);
      std::vector<double,_std::allocator<double>_>::operator=
                (&vStack_5b28,&highs_solution->row_dual);
      qp_model_status = kNotset;
      dVar27 = 0.0;
LAB_0032ef04:
      QpVector::QpVector(&res,instance->num_var);
      QpVector::QpVector(&x0,instance->num_con);
      if (0 < res.dim) {
        lVar22 = 0;
        HVar18 = res.dim;
        do {
          if (dVar27 < ABS(L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish[lVar22])) {
            res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar22] =
                 L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish[lVar22];
            lVar20 = (long)res.num_nz;
            res.num_nz = res.num_nz + 1;
            *(int *)(CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._2_6_,
                              res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_2_) + lVar20 * 4) = (int)lVar22;
            HVar18 = res.dim;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < HVar18);
      }
      if (0 < x0.dim) {
        lVar22 = 0;
        HVar18 = x0.dim;
        do {
          if (dVar27 < ABS(local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar22])) {
            x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar22] =
                 local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22];
            lVar20 = (long)x0.num_nz;
            x0.num_nz = x0.num_nz + 1;
            x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar20] = (int)lVar22;
            HVar18 = x0.dim;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < HVar18);
      }
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = 0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&debug_row_status_count,5,(value_type_conflict2 *)&debug_col_status_count);
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      if (0 < (int)vStack_5b90.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_finish -
              (int)vStack_5b90.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_start) {
        iVar13 = 0;
        do {
          HVar3 = vStack_5b90.
                  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar13];
          debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[HVar3] =
               debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[HVar3] + 1;
          switch((ulong)HVar3) {
          case 0:
            if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&initialinactive,
                         (iterator)
                         initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&debug_col_status_count);
            }
            else {
              *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (BasisStatus)
                   debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_5cc0 = kActiveAtLower;
            if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                        (&initial_status,
                         (iterator)
                         initial_status.
                         super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_5cc0);
            }
            else {
              *initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish = kActiveAtLower;
LAB_0032f18a:
              initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            break;
          case 1:
            break;
          case 2:
            if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&initialinactive,
                         (iterator)
                         initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&debug_col_status_count);
            }
            else {
              *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (BasisStatus)
                   debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_5cc0 = kActiveAtUpper;
            if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              *initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish = kActiveAtUpper;
              goto LAB_0032f18a;
            }
            std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                      (&initial_status,
                       (iterator)
                       initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_5cc0);
            break;
          default:
            if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&atlower,
                         (iterator)
                         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(int *)&debug_col_status_count);
            }
            else {
              *atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (BasisStatus)
                   debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          iVar13 = (BasisStatus)
                   debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
          debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(debug_col_status_count.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,iVar13);
        } while (iVar13 < (int)vStack_5b90.
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                          (int)vStack_5b90.
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      }
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5cc0 = kInactive;
      highs_solution_00 = (HighsSolution *)0x32f1fa;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&debug_col_status_count,5,(value_type_conflict2 *)&local_5cc0);
      if (0 < (int)local_5ba8.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_finish -
              (int)local_5ba8.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_start) {
        lVar22 = 0;
        do {
          HVar3 = local_5ba8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar22];
          debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[HVar3] =
               debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[HVar3] + 1;
          iVar13 = (int)lVar22;
          switch((ulong)HVar3) {
          case 0:
            if ((-INFINITY <
                 (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22]) ||
               ((instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar22] < INFINITY)) {
              local_5cc0 = instance->num_con + iVar13;
              if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                highs_solution_00 = (HighsSolution *)0x32f3ec;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&initialinactive,
                           (iterator)
                           initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_5cc0);
              }
              else {
                *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_5cc0;
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_5cc0 = kActiveAtLower;
              if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                highs_solution_00 = (HighsSolution *)0x32f42d;
                std::vector<BasisStatus,_std::allocator<BasisStatus>_>::
                _M_realloc_insert<BasisStatus>
                          (&initial_status,
                           (iterator)
                           initial_status.
                           super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_5cc0);
              }
              else {
                *initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                 _M_impl.super__Vector_impl_data._M_finish = kActiveAtLower;
LAB_0032f406:
                initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_finish =
                     initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              local_5cc0 = instance->num_con + iVar13;
              if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_0032f339;
              highs_solution_00 = (HighsSolution *)0x32f29f;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&atlower,
                         (iterator)
                         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(int *)&local_5cc0);
            }
            break;
          case 1:
            break;
          case 2:
            if ((-INFINITY <
                 (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22]) ||
               ((instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar22] < INFINITY)) {
              local_5cc0 = instance->num_con + iVar13;
              if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                highs_solution_00 = (HighsSolution *)0x32f3c0;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&initialinactive,
                           (iterator)
                           initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_5cc0);
              }
              else {
                *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_5cc0;
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_5cc0 = kActiveAtUpper;
              if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                *initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                 _M_impl.super__Vector_impl_data._M_finish = kActiveAtUpper;
                goto LAB_0032f406;
              }
              highs_solution_00 = (HighsSolution *)0x32f41e;
              std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                        (&initial_status,
                         (iterator)
                         initial_status.
                         super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_5cc0);
            }
            else {
              local_5cc0 = instance->num_con + iVar13;
              if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_0032f339;
              highs_solution_00 = (HighsSolution *)0x32f2f6;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&atlower,
                         (iterator)
                         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(int *)&local_5cc0);
            }
            break;
          case 3:
            local_5cc0 = instance->num_con + iVar13;
            if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              highs_solution_00 = (HighsSolution *)0x32f31d;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&atlower,
                         (iterator)
                         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(int *)&local_5cc0);
            }
            else {
LAB_0032f339:
              *atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish = local_5cc0;
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            break;
          default:
            local_5cc0 = instance->num_con + iVar13;
            if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_0032f339;
            highs_solution_00 = (HighsSolution *)0x32f3ae;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&atlower,
                       (iterator)
                       atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                       .super__Vector_impl_data._M_finish,(int *)&local_5cc0);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < (int)local_5ba8.
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_5ba8.
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      }
      if (instance->num_var ==
          (int)((ulong)((long)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2) +
          (int)((ulong)((long)initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       CONCAT44(initialinactive.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                initialinactive.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_)) >> 2)) {
        std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
                  (&local_5ae8.status,&initial_status);
        std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.active,&initialinactive);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_5ae8.inactive,(vector<int,_std::allocator<int>_> *)&atlower);
        local_5ae8.primal.num_nz = res.num_nz;
        local_5ae8.primal.dim = res.dim;
        std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.primal.index,&res.index);
        std::vector<double,_std::allocator<double>_>::operator=(&local_5ae8.primal.value,&res.value)
        ;
        local_5ae8.rowact.num_nz = x0.num_nz;
        local_5ae8.rowact.dim = x0.dim;
        std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.rowact.index,&x0.index);
        highs_solution_00 = (HighsSolution *)0x32f525;
        std::vector<double,_std::allocator<double>_>::operator=(&local_5ae8.rowact.value,&x0.value);
      }
      else {
        qp_model_status = kError;
      }
      if (debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x32fa8f;
        operator_delete(debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x32faa1;
        operator_delete(debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x32fab0;
        operator_delete(initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x32fabf;
        operator_delete(atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT44(initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        highs_solution_00 = (HighsSolution *)0x32fad1;
        operator_delete((void *)CONCAT44(initialinactive.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start._4_4_,
                                         initialinactive.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start._0_4_));
      }
      if (x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x32fae3;
        operator_delete(x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x32faf5;
        operator_delete(x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x32fb07;
        operator_delete(res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._2_6_,
                           res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_2_) != (void *)0x0) {
        highs_solution_00 = (HighsSolution *)0x32fb1d;
        operator_delete((void *)CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._2_6_,
                                         res.index.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_2_));
      }
    }
    if (vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32fc98;
      operator_delete(vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32fcaa;
      operator_delete(local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32fcbc;
      operator_delete(vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32fcce;
      operator_delete(L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    }
    if (vStack_5b90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32fce0;
      operator_delete(vStack_5b90.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_5ba8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x32fcf2;
      operator_delete(local_5ba8.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != &local_5bb8) {
      highs_solution_00 = (HighsSolution *)0x32fd04;
      operator_delete(initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (qp_model_status != kNotset) goto LAB_0032fd42;
  }
  solveqp_actual(instance,settings,&local_5ae8,local_5be0,&qp_model_status,&local_5698,qp_timer);
LAB_0032fd42:
  QVar12 = quass2highs(instance,settings,(Statistics *)&qp_model_status,(QpModelStatus *)&local_5698
                       ,local_5b10,(HighsModelStatus *)highs_basis,(HighsBasis *)highs_solution,
                       highs_solution_00);
  if (local_5ae8.rowact.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.rowact.value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5ae8.rowact.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.rowact.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5ae8.primal.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.primal.value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5ae8.primal.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.primal.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5ae8.status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5ae8.inactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.inactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5ae8.active.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.active.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  QpSolution::~QpSolution(&local_5698);
  return QVar12;
}

Assistant:

QpAsmStatus solveqp(Instance& instance, Settings& settings, Statistics& stats,
                    HighsModelStatus& highs_model_status,
                    HighsBasis& highs_basis, HighsSolution& highs_solution,
                    HighsTimer& qp_timer) {
  QpModelStatus qp_model_status = QpModelStatus::kUndetermined;

  QpSolution qp_solution(instance);

  // presolve

  // scale instance, store scaling factors

  // perturb instance, store perturbance information

  // regularize
  for (HighsInt i = 0; i < instance.num_var; i++) {
    for (HighsInt index = instance.Q.mat.start[i];
         index < instance.Q.mat.start[i + 1]; index++) {
      if (instance.Q.mat.index[index] == i) {
        instance.Q.mat.value[index] += settings.hessianregularizationfactor;
      }
    }
  }

  // compute initial feasible point
  QpHotstartInformation startinfo(instance.num_var, instance.num_con);
  if (instance.num_con == 0 && instance.num_var <= 15000) {
    computeStartingPointBounded(instance, settings, stats, qp_model_status,
                                startinfo, qp_timer);
    if (qp_model_status == QpModelStatus::kOptimal) {
      qp_solution.primal = startinfo.primal;
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
    if (qp_model_status == QpModelStatus::kUnbounded) {
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
  } else {
    computeStartingPointHighs(instance, settings, stats, qp_model_status,
                              startinfo, highs_model_status, highs_basis,
                              highs_solution, qp_timer);
    if (qp_model_status != QpModelStatus::kNotset) {
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
  }

  // solve
  solveqp_actual(instance, settings, startinfo, stats, qp_model_status,
                 qp_solution, qp_timer);

  // undo perturbation and resolve

  // undo scaling and resolve

  // postsolve

  // Transform QP status and qp_solution to HiGHS highs_basis and highs_solution
  return quass2highs(instance, settings, stats, qp_model_status, qp_solution,
                     highs_model_status, highs_basis, highs_solution);
}